

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool Utils::compareClsidType(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,string *clsid)

{
  int iVar1;
  uint uVar2;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  int to;
  pointer puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_00;
  char *pcVar8;
  char *__x;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_78;
  string sStack_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_40;
  
  uVar14 = 0;
  bVar15 = false;
  iVar10 = 0;
  while ((uVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar14], uVar2 == 0 &&
         ((clsid->_M_string_length & 0xfffffffffffffffe) == 0xe))) {
LAB_00113922:
    bVar15 = 0xe < uVar14;
    uVar14 = uVar14 + 1;
    if (uVar14 == 0x10) {
      return bVar15;
    }
  }
  uVar6 = (ulong)iVar10;
  if (uVar6 < clsid->_M_string_length) {
    if ((char)uVar2 != (clsid->_M_dataplus)._M_p[uVar6]) {
      return bVar15;
    }
    iVar10 = iVar10 + 1;
    goto LAB_00113922;
  }
  __x = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
  puVar7 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar7) {
LAB_001139f8:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  }
  else {
    uVar2 = *puVar7;
    switch(uVar2) {
    case 0x30:
    case 0x33:
    case 0x34:
switchD_0011397f_caseD_30:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"UNKNOWN type for ItemID",0x17);
      goto LAB_001139f8;
    case 0x31:
      pcVar8 = "TYPE_DIRECTORY: ";
      lVar11 = 0x10;
      break;
    case 0x32:
      pcVar8 = "TYPE_FILE: ";
      lVar11 = 0xb;
      break;
    case 0x35:
      pcVar8 = "TYPE_DIRECTORY_OLD: ";
      lVar11 = 0x14;
      break;
    case 0x36:
      pcVar8 = "TYPE_FILE_OLD: ";
      lVar11 = 0xf;
      break;
    default:
      if (uVar2 == 0x1f) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TYPE_CLSID: ",0xc)
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&vStack_40,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
        printSid(&vStack_40,2);
        if (vStack_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        puVar7 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (8 < (ulong)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar7)) {
          uVar14 = 2;
          lVar11 = 8;
          do {
            if (vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&vStack_90,
                         (iterator)
                         vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)((long)puVar7 + lVar11));
            }
            else {
              *vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(uint *)((long)puVar7 + lVar11);
              vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            uVar14 = uVar14 + 1;
            puVar7 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar11 = lVar11 + 4;
          } while (uVar14 < (ulong)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           __x)->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7
                                   >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&vStack_78,&vStack_90);
        getClsidType_abi_cxx11_(&sStack_60,(Utils *)&vStack_78,vec_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,sStack_60._M_dataplus._M_p,
                            sStack_60._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        paVar5 = &sStack_60.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_60._M_dataplus._M_p != paVar5) {
          operator_delete(sStack_60._M_dataplus._M_p,sStack_60.field_2._M_allocated_capacity + 1);
          paVar5 = extraout_RAX;
        }
        uVar3 = SUB81(paVar5,0);
        if (vStack_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          uVar3 = extraout_AL;
        }
        if (vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          uVar3 = extraout_AL_00;
        }
        return (bool)uVar3;
      }
      if (uVar2 != 0x23) goto switchD_0011397f_caseD_30;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TYPE_DRIVE_OLD: ",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    case 0x2f:
      print_vec_unicode((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
      goto LAB_001139f8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Short Name: ",0xe);
    puVar7 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar7 >> 2;
    uVar14 = 0xc;
    bVar15 = 0xc < uVar6;
    iVar10 = (int)uVar6;
    if ((bVar15) && (puVar7[0xc] != 0)) {
      uVar9 = 0xc;
      do {
        if ((0xd - uVar6) + uVar9 == 0xc) {
          bVar15 = uVar9 + 1 < uVar6;
          uVar14 = uVar6 & 0xffffffff;
          goto LAB_00113cbd;
        }
        uVar14 = uVar9 + 1;
        lVar11 = uVar9 + 1;
        uVar9 = uVar14;
      } while (puVar7[lVar11] != 0);
      bVar15 = uVar14 < uVar6;
    }
LAB_00113cbd:
    to = iVar10 + -1;
    if (bVar15) {
      to = (int)uVar14;
    }
    iVar13 = to;
    if (0 < (iVar10 + -0xf) - to) {
      iVar12 = -to;
      puVar7 = puVar7 + (long)to + 0xe;
      do {
        if (((((puVar7[-0xe] == 0) && (puVar7[-0xd] == 0)) && (puVar7[-0xc] == 0)) &&
            (((puVar7[-0xb] == 0 && (puVar7[-10] == 0)) &&
             ((puVar7[-9] == 0 && ((puVar7[-8] == 0 && (puVar7[-7] == 0)))))))) &&
           ((puVar7[-6] == 0 &&
            (((((puVar7[-5] == 0 && (puVar7[-4] == 0)) && (puVar7[-3] == 0)) &&
              ((puVar7[-2] == 0 && (puVar7[-1] == 0)))) && (*puVar7 == 0)))))) {
          iVar13 = -iVar12;
          break;
        }
        puVar7 = puVar7 + 1;
        iVar1 = iVar10 + iVar12;
        iVar12 = iVar12 + -1;
        iVar13 = iVar10 + -0xf;
      } while (1 < iVar1 + -0xf);
    }
    print_vec_unicode_from_to((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x,0xc,to);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Long Name:  ",0xe);
    print_vec_unicode_from_to
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x,iVar13 + 0x13,
               (int)((ulong)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  }
  std::ostream::put('(');
  uVar3 = std::ostream::flush();
  return (bool)uVar3;
}

Assistant:

bool Utils::compareClsidType(std::vector<unsigned int> vec, std::string clsid) {
    int j = 0;      // Used for cases when clsid contains \x00 -> I remove all \x00 from clsid-s and it's len = 15 or 14

    for(int i = 0 ; i < 16; ++i) {
        if((vec[i] == 0x00) && (clsid.size() == 15 || clsid.size() == 14))
            continue;

        if((char)vec[i] != (char)clsid.at(j))
            return false;

        ++j;
    }
    return true;
}